

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O1

CMConnection
libcmudp_LTX_initiate_conn
          (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,attr_list attrs)

{
  undefined8 uVar1;
  int iVar2;
  uint *puVar3;
  attr_list p_Var4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  CMConnection p_Var9;
  size_t __n;
  char *host_name;
  int int_port_num;
  char *local_70;
  uint local_64;
  attr_list local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  transport_entry_conflict local_40;
  void *local_38;
  
  puVar3 = (uint *)(*svc->malloc_func)(0x48);
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[1] = 0xffffffff;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  p_Var4 = (attr_list)create_attr_list();
  local_38 = trans->trans_data;
  local_58 = 0;
  uStack_50 = 0;
  iVar2 = query_attr(attrs,CM_IP_HOSTNAME,0,&local_70);
  if (iVar2 == 0) {
    (*svc->trace_out)(cm,"UDP transport found no UDP_HOST attribute");
    local_70 = (char *)0x0;
  }
  else {
    (*svc->trace_out)(cm,"UDP transport connect to host %s",local_70);
  }
  iVar2 = query_attr(attrs,CM_UDP_ADDR,0,&initiate_udp_conn_udp_ip);
  if (iVar2 == 0) {
    (*svc->trace_out)(cm,"CMUDP transport found no UDP_ADDR attribute");
    initiate_udp_conn_udp_ip = 0;
  }
  else {
    (*svc->trace_out)(cm,"CMUDP transport connect to UDP_IP %lx",(ulong)initiate_udp_conn_udp_ip);
  }
  if ((local_70 != (char *)0x0) || (initiate_udp_conn_udp_ip != 0)) {
    iVar2 = query_attr(attrs,CM_UDP_PORT,0,&local_64);
    if (iVar2 != 0) {
      local_60 = p_Var4;
      (*svc->trace_out)(cm,"CMUDP transport connect to port %d",(ulong)local_64);
      pcVar5 = getenv("CM_NETWORK");
      if (local_70 == (char *)0x0 || pcVar5 == (char *)0x0) {
        if (local_70 == (char *)0x0) {
          local_58 = (ulong)(initiate_udp_conn_udp_ip >> 0x18 |
                             (initiate_udp_conn_udp_ip & 0xff0000) >> 8 |
                             (initiate_udp_conn_udp_ip & 0xff00) << 8 |
                            initiate_udp_conn_udp_ip << 0x18) << 0x20;
          p_Var4 = local_60;
        }
        else {
          iVar2 = check_host(local_70,(void *)((long)&local_58 + 4));
          p_Var4 = local_60;
          if (iVar2 == 0) {
            if (initiate_udp_conn_udp_ip == 0) {
              (*svc->trace_out)(cm,
                                "CMSocket connect FAILURE --> Host not found \"%s\", no IP addr supplied in contact list"
                               );
            }
            else {
              pcVar5 = "(unknown)";
              if (local_70 != (char *)0x0) {
                pcVar5 = local_70;
              }
              (*svc->trace_out)(cm,"CMSOCKET --> Host not found \"%s\", Using supplied IP addr %x",
                                pcVar5);
              local_58 = (ulong)(initiate_udp_conn_udp_ip >> 0x18 |
                                 (initiate_udp_conn_udp_ip & 0xff0000) >> 8 |
                                 (initiate_udp_conn_udp_ip & 0xff00) << 8 |
                                initiate_udp_conn_udp_ip << 0x18) << 0x20;
            }
          }
        }
      }
      else {
        local_40 = trans;
        sVar6 = strlen(local_70);
        sVar7 = strlen(pcVar5);
        __n = sVar6 + sVar7 + 2;
        __dest = (char *)(*svc->malloc_func)(__n);
        pcVar8 = strchr(local_70,0x2e);
        memset(__dest,0,__n);
        if (pcVar8 == (char *)0x0) {
          strcpy(__dest,local_70);
        }
        else {
          strncpy(__dest,local_70,(long)pcVar8 - (long)local_70);
          strcat(__dest,pcVar5);
          pcVar5 = pcVar8;
        }
        strcat(__dest,pcVar5);
        iVar2 = check_host(__dest,(void *)((long)&local_58 + 4));
        if (iVar2 == 0) {
          iVar2 = check_host(local_70,(void *)((long)&local_58 + 4));
          trans = local_40;
          p_Var4 = local_60;
          if (iVar2 == 0) {
            (*svc->trace_out)(cm,"--> Host not found \"%s\"",local_70);
          }
        }
        else {
          (*svc->trace_out)(cm,"--> Using non default network interface with hostname %s",__dest);
          p_Var4 = local_60;
          trans = local_40;
        }
        (*svc->free_func)(__dest);
      }
      local_58._0_4_ = CONCAT22((ushort)local_64 << 8 | (ushort)local_64 >> 8,2);
      (*svc->trace_out)(cm,"--> Connection established");
      *puVar3 = initiate_udp_conn_udp_ip;
      puVar3[1] = local_64;
      puVar3[2] = (uint)local_58;
      puVar3[3] = local_58._4_4_;
      puVar3[4] = (uint)uStack_50;
      puVar3[5] = uStack_50._4_4_;
      *(void **)(puVar3 + 10) = local_38;
      add_attr(p_Var4,CM_UDP_ADDR,1,(long)(int)*puVar3);
      add_attr(p_Var4,CM_UDP_PORT,1,(long)(int)puVar3[1]);
      p_Var9 = (*svc->connection_create)(trans,puVar3,p_Var4);
      uVar1 = *(undefined8 *)(*(long *)(puVar3 + 10) + 0x28);
      *(uint **)(*(long *)(puVar3 + 10) + 0x28) = puVar3;
      *(undefined8 *)(puVar3 + 0x10) = uVar1;
      *(CMConnection *)(puVar3 + 0xc) = p_Var9;
      *(attr_list *)(puVar3 + 0xe) = p_Var4;
      (*svc->connection_addref)(p_Var9);
      return p_Var9;
    }
    (*svc->trace_out)(cm,"CMUDP transport found no UDP_PORT attribute");
  }
  return (CMConnection)0x0;
}

Assistant:

extern CMConnection
libcmudp_LTX_initiate_conn(CManager cm, CMtrans_services svc, transport_entry trans, attr_list attrs)
{
    udp_conn_data_ptr udp_conn_data = create_udp_conn_data(svc);
    attr_list conn_attr_list = create_attr_list();
    CMConnection conn;

    if (initiate_udp_conn(cm, svc, trans, attrs, udp_conn_data, conn_attr_list) != 1) {
	return NULL;
    }

    add_attr(conn_attr_list, CM_UDP_ADDR, Attr_Int4,
	     (attr_value) (long)udp_conn_data->udp_IP);
    add_attr(conn_attr_list, CM_UDP_PORT, Attr_Int4,
	     (attr_value) (long)udp_conn_data->udp_port);

    conn = svc->connection_create(trans, udp_conn_data, conn_attr_list);
    add_connection(udp_conn_data->utd, udp_conn_data);
    udp_conn_data->conn = conn;
    udp_conn_data->attrs = conn_attr_list;
    svc->connection_addref(conn);  /* one ref count went to select (and CM), 
				the other to the user */
    return conn;
}